

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.cxx
# Opt level: O0

bufptr __thiscall cornerstone::snapshot::serialize(snapshot *this)

{
  pointer pbVar1;
  buffer *this_00;
  _Head_base<0UL,_cornerstone::buffer_*,_false> extraout_RDX;
  buffer *in_RSI;
  _Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false> in_RDI;
  bufptr bVar2;
  cluster_config *in_stack_00000038;
  bufptr conf_buf;
  bufptr *buf;
  undefined1 *val;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 uVar3;
  buffer *in_stack_ffffffffffffffe0;
  
  std::__shared_ptr_access<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1e4d2e);
  val = &stack0xffffffffffffffe0;
  cluster_config::serialize(in_stack_00000038);
  uVar3 = 0;
  pbVar1 = std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::operator->
                     ((unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)0x1e4d4f);
  this_00 = (buffer *)buffer::size(pbVar1);
  buffer::alloc(CONCAT17(uVar3,in_stack_ffffffffffffffd8));
  std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::operator->
            ((unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)0x1e4d7d);
  buffer::put(this_00,(ulong)val);
  std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::operator->
            ((unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)0x1e4d99);
  buffer::put(this_00,(ulong)val);
  std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::operator->
            ((unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)0x1e4db6);
  buffer::put(this_00,(ulong)val);
  pbVar1 = std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::operator->
                     ((unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)0x1e4dd3);
  std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::operator*
            ((unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)pbVar1);
  buffer::put(in_stack_ffffffffffffffe0,(buffer *)CONCAT17(uVar3,in_stack_ffffffffffffffd8));
  std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::operator->
            ((unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)0x1e4e04);
  buffer::pos(in_RSI,(size_t)in_RDI._M_head_impl);
  std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::~unique_ptr
            ((unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)pbVar1);
  bVar2._M_t.super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
  super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>.
  super__Head_base<0UL,_cornerstone::buffer_*,_false>._M_head_impl = extraout_RDX._M_head_impl;
  bVar2._M_t.super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
  super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>.
  super__Tuple_impl<1UL,_void_(*)(cornerstone::buffer_*)>.
  super__Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false>)
       (_Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false>)in_RDI._M_head_impl;
  return (bufptr)bVar2._M_t.
                 super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
                 super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>;
}

Assistant:

bufptr snapshot::serialize()
{
    bufptr conf_buf = last_config_->serialize();
    bufptr buf = buffer::alloc(conf_buf->size() + sz_ulong * 3);
    buf->put(last_log_idx_);
    buf->put(last_log_term_);
    buf->put(size_);
    buf->put(*conf_buf);
    buf->pos(0);
    return buf;
}